

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

Chainstate * __thiscall
ChainstateManager::ActivateExistingSnapshot(ChainstateManager *this,uint256 base_blockhash)

{
  Chainstate *pCVar1;
  _Alloc_hider __p;
  unsigned_long uVar2;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  undefined1 local_50 [8];
  string local_48;
  pointer local_28;
  
  local_28 = *(pointer *)(in_FS_OFFSET + 0x28);
  if ((this->m_snapshot_chainstate)._M_t.
      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) {
    __assert_fail("!m_snapshot_chainstate",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1889,"Chainstate &ChainstateManager::ActivateExistingSnapshot(uint256)");
  }
  local_50 = (undefined1  [8])0x0;
  std::make_unique<Chainstate,decltype(nullptr),node::BlockManager&,ChainstateManager&,uint256&>
            ((void **)&local_48,(BlockManager *)local_50,(ChainstateManager *)&this->m_blockman,
             (uint256 *)this);
  __p._M_p = local_48._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)0x0;
  std::__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>::reset
            ((__uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_> *)
             &this->m_snapshot_chainstate,(pointer)__p._M_p);
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::~unique_ptr
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)&local_48);
  Chainstate::ToString_abi_cxx11_
            (&local_48,
             (this->m_snapshot_chainstate)._M_t.
             super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
             super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
             super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
  logging_function._M_str = "ActivateExistingSnapshot";
  logging_function._M_len = 0x18;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
  ;
  source_file._M_len = 0x5e;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,0x188c,ALL,Info,(ConstevalFormatString<1U>)0x6c68a0,
             &local_48);
  std::__cxx11::string::~string((string *)&local_48);
  uVar2 = CTxMemPool::size(this->m_active_chainstate->m_mempool);
  local_48._M_dataplus._M_p._0_1_ = uVar2 == 0;
  inline_assertion_check<true,bool>
            ((bool *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x188f,"ActivateExistingSnapshot","m_active_chainstate->m_mempool->size() == 0");
  local_48._M_dataplus._M_p._0_1_ =
       ((this->m_snapshot_chainstate)._M_t.
        super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
        super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
        super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool == (CTxMemPool *)0x0;
  inline_assertion_check<true,bool>
            ((bool *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x1890,"ActivateExistingSnapshot","!m_snapshot_chainstate->m_mempool");
  pCVar1 = this->m_active_chainstate;
  ((this->m_snapshot_chainstate)._M_t.
   super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
   super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
   super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl)->m_mempool = pCVar1->m_mempool;
  pCVar1->m_mempool = (CTxMemPool *)0x0;
  pCVar1 = (this->m_snapshot_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  this->m_active_chainstate = pCVar1;
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_28) {
    return pCVar1;
  }
  __stack_chk_fail();
}

Assistant:

Chainstate& ChainstateManager::ActivateExistingSnapshot(uint256 base_blockhash)
{
    assert(!m_snapshot_chainstate);
    m_snapshot_chainstate =
        std::make_unique<Chainstate>(nullptr, m_blockman, *this, base_blockhash);
    LogPrintf("[snapshot] switching active chainstate to %s\n", m_snapshot_chainstate->ToString());

    // Mempool is empty at this point because we're still in IBD.
    Assert(m_active_chainstate->m_mempool->size() == 0);
    Assert(!m_snapshot_chainstate->m_mempool);
    m_snapshot_chainstate->m_mempool = m_active_chainstate->m_mempool;
    m_active_chainstate->m_mempool = nullptr;
    m_active_chainstate = m_snapshot_chainstate.get();
    return *m_snapshot_chainstate;
}